

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O1

Time __thiscall helics::TimeCoordinator::generateAllowedTime(TimeCoordinator *this,Time testTime)

{
  ulong uVar1;
  Time TVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  lVar5 = 0x7fffffffffffffff;
  uVar1 = (this->info).period.internalTimeCode;
  TVar2.internalTimeCode = testTime.internalTimeCode;
  if (testTime.internalTimeCode != 0x7fffffffffffffff && 1 < (long)uVar1) {
    lVar3 = (this->time_grantBase).internalTimeCode;
    TVar2.internalTimeCode = (this->info).offset.internalTimeCode;
    if ((TVar2.internalTimeCode <= lVar3) ||
       (lVar3 = TVar2.internalTimeCode, TVar2.internalTimeCode < testTime.internalTimeCode)) {
      lVar4 = testTime.internalTimeCode - lVar3;
      if ((long)uVar1 < lVar4) {
        dVar7 = (double)((int)uVar1 + (int)(uVar1 / 1000000000) * -1000000000) * 1e-09 +
                (double)(uVar1 / 1000000000);
        dVar6 = ceil(((double)(lVar4 % 1000000000) * 1e-09 + (double)(lVar4 / 1000000000)) / dVar7);
        dVar6 = dVar6 * dVar7;
        if (dVar6 <= -9223372036.854765) {
          lVar5 = -0x7fffffffffffffff;
        }
        else if (dVar6 < 9223372036.854765) {
          lVar5 = (long)(dVar6 * 1000000000.0 +
                        *(double *)(&DAT_003d20a0 + (ulong)(0.0 <= dVar6 * 1000000000.0) * 8));
        }
        TVar2.internalTimeCode = lVar5 + lVar3;
      }
      else {
        TVar2.internalTimeCode = lVar3 + uVar1;
      }
    }
  }
  return (Time)TVar2.internalTimeCode;
}

Assistant:

Time TimeCoordinator::generateAllowedTime(Time testTime) const
{
    if (info.period > timeEpsilon) {
        if (testTime == Time::maxVal()) {
            return testTime;
        }
        auto timeBase = time_grantBase;
        if (time_grantBase < info.offset) {
            timeBase = info.offset;
            if (testTime <= info.offset) {
                return info.offset;
            }
        }
        if (testTime - timeBase > info.period) {
            auto blk = std::ceil((testTime - timeBase) / info.period);
            testTime = timeBase + blk * info.period;
        } else {
            testTime = timeBase + info.period;
        }
    }
    return testTime;
}